

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

char * __thiscall leveldb::Arena::AllocateAligned(Arena *this,size_t bytes)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar1 = this->alloc_ptr_;
  uVar4 = (ulong)((uint)pcVar1 & 7);
  lVar2 = 8 - uVar4;
  if (uVar4 == 0) {
    lVar2 = 0;
  }
  uVar4 = lVar2 + bytes;
  if (this->alloc_bytes_remaining_ < uVar4) {
    pcVar3 = AllocateFallback(this,bytes);
  }
  else {
    pcVar3 = pcVar1 + lVar2;
    this->alloc_ptr_ = pcVar1 + uVar4;
    this->alloc_bytes_remaining_ = this->alloc_bytes_remaining_ - uVar4;
  }
  if (((ulong)pcVar3 & 7) == 0) {
    return pcVar3;
  }
  __assert_fail("(reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/arena.cc"
                ,0x36,"char *leveldb::Arena::AllocateAligned(size_t)");
}

Assistant:

char* Arena::AllocateAligned(size_t bytes) {
  const int align = (sizeof(void*) > 8) ? sizeof(void*) : 8;
  static_assert((align & (align - 1)) == 0,
                "Pointer size should be a power of 2");
  size_t current_mod = reinterpret_cast<uintptr_t>(alloc_ptr_) & (align - 1);
  size_t slop = (current_mod == 0 ? 0 : align - current_mod);
  size_t needed = bytes + slop;
  char* result;
  if (needed <= alloc_bytes_remaining_) {
    result = alloc_ptr_ + slop;
    alloc_ptr_ += needed;
    alloc_bytes_remaining_ -= needed;
  } else {
    // AllocateFallback always returned aligned memory
    result = AllocateFallback(bytes);
  }
  assert((reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0);
  return result;
}